

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O2

string * __thiscall
CJSON::ParseNull_abi_cxx11_(string *__return_storage_ptr__,CJSON *this,char **beg,char **end)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  CJSONException *this_00;
  allocator<char> local_41;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar3 = *beg;
  while (pcVar3 != *end) {
    cVar1 = *pcVar3;
    if (((cVar1 == ',') || (cVar1 == ']')) || (cVar1 == '}')) break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    pcVar3 = *beg + 1;
    *beg = pcVar3;
  }
  *beg = pcVar3 + -1;
  bVar2 = std::operator!=(__return_storage_ptr__,"null");
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  this_00 = (CJSONException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Expected null",&local_41);
  CJSONException::CJSONException(this_00,&local_40,EXPECTED_NULL);
  __cxa_throw(this_00,&CJSONException::typeinfo,CJSONException::~CJSONException);
}

Assistant:

inline std::string ParseNull(const char *&beg, const char *&end)
        {
            std::string Ret;

            while (beg != end)
            {
                if(*beg == ',' || *beg == '}' || *beg == ']')
                    break;

                Ret += *beg;

                beg++;
            } 

            beg--;

            if(Ret != "null")
                throw CJSONException("Expected null", JSONErrorType::EXPECTED_NULL);

            return Ret;
        }